

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 65816Storage.cpp
# Opt level: O1

void CPU::WDC65816::ProcessorStorageConstructor::read_write
               (AccessType type,bool is8bit,function<void_(CPU::WDC65816::MicroOp)> *target)

{
  undefined8 in_RAX;
  MicroOp *pMVar1;
  undefined8 uStack_18;
  
  if (type == Write) {
    uStack_18._3_5_ = (undefined5)((ulong)in_RAX >> 0x18);
    uStack_18._0_3_ = CONCAT12(0x2e,(short)in_RAX);
    if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
      (*target->_M_invoker)((_Any_data *)target,(MicroOp *)((long)&uStack_18 + 2));
      if (!is8bit) {
        uStack_18._0_4_ = CONCAT13(0x11,(undefined3)uStack_18);
        if ((target->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_003eb4ca;
        (*target->_M_invoker)((_Any_data *)target,(MicroOp *)((long)&uStack_18 + 3));
      }
      uStack_18._0_5_ = CONCAT14(0xf,(undefined4)uStack_18);
      if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
        pMVar1 = (MicroOp *)((long)&uStack_18 + 4);
LAB_003eb4bd:
        (*target->_M_invoker)((_Any_data *)target,pMVar1);
        return;
      }
    }
  }
  else {
    uStack_18 = in_RAX;
    if (!is8bit) {
      uStack_18._6_2_ = (undefined2)((ulong)in_RAX >> 0x30);
      uStack_18._0_5_ = (undefined5)in_RAX;
      uStack_18._0_6_ = CONCAT15(7,(undefined5)uStack_18);
      if ((target->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_003eb4ca;
      (*target->_M_invoker)((_Any_data *)target,(MicroOp *)((long)&uStack_18 + 5));
    }
    uStack_18._0_7_ = CONCAT16(6,(undefined6)uStack_18);
    if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
      (*target->_M_invoker)((_Any_data *)target,(MicroOp *)((long)&uStack_18 + 6));
      uStack_18 = CONCAT17(0x2e,(undefined7)uStack_18);
      if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
        pMVar1 = (MicroOp *)((long)&uStack_18 + 7);
        goto LAB_003eb4bd;
      }
    }
  }
LAB_003eb4ca:
  std::__throw_bad_function_call();
}

Assistant:

static void read_write(AccessType type, bool is8bit, const std::function<void(MicroOp)> &target) {
		if(type == AccessType::Write) {
			target(OperationPerform);						// Perform operation to fill the data buffer.
			if(!is8bit) target(CycleStoreIncrementData);	// Data low.
			target(CycleStoreData);							// Data [high].
		} else {
			if(!is8bit) target(CycleFetchIncrementData);	// Data low.
			target(CycleFetchData);							// Data [high].
			target(OperationPerform);						// Perform operation from the data buffer.
		}
	}